

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::setPos(QGraphicsItem *this,QPointF *pos)

{
  QGraphicsItemPrivate *pQVar1;
  bool bVar2;
  QGraphicsWidgetPrivate *this_00;
  long in_FS_OFFSET;
  QVariant QStack_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = qFuzzyCompare(&((this->d_ptr).d)->pos,pos);
  if (!bVar2) {
    pQVar1 = (this->d_ptr).d;
    if ((*(ulong *)&pQVar1->field_0x160 >> 0x37 & 1) == 0) {
      if ((*(ulong *)&pQVar1->field_0x160 & 0x1080000000000) == 0) {
        (*pQVar1->_vptr_QGraphicsItemPrivate[3])(pQVar1,pos);
        this_00 = (QGraphicsWidgetPrivate *)(this->d_ptr).d;
        if (((this_00->super_QGraphicsItemPrivate).field_0x163 & 1) != 0) {
          QGraphicsWidgetPrivate::setGeometryFromSetPos(this_00);
          this_00 = (QGraphicsWidgetPrivate *)(this->d_ptr).d;
        }
        if (((this_00->super_QGraphicsItemPrivate).field_0x168 & 0x80) != 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            QGraphicsItemPrivate::sendScenePosChange(&this_00->super_QGraphicsItemPrivate);
            return;
          }
          goto LAB_00575d5f;
        }
      }
      else {
        local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::fromValue<QPointF>
                  ((enable_if_t<std::is_copy_constructible_v<QPointF>_&&_std::is_destructible_v<QPointF>,_QVariant>
                    *)&local_68,pos);
        (*this->_vptr_QGraphicsItem[0x21])(&local_48,this,0,&local_68);
        ::QVariant::~QVariant((QVariant *)&local_68);
        local_68.shared = (PrivateShared *)::QVariant::toPointF();
        bVar2 = qFuzzyCompare((QPointF *)&local_68,&((this->d_ptr).d)->pos);
        if (!bVar2) {
          pQVar1 = (this->d_ptr).d;
          (*pQVar1->_vptr_QGraphicsItemPrivate[3])(pQVar1,&local_68);
          (*this->_vptr_QGraphicsItem[0x21])(&QStack_88,this,9,&local_48);
          ::QVariant::~QVariant(&QStack_88);
          QGraphicsItemPrivate::sendScenePosChange((this->d_ptr).d);
        }
        ::QVariant::~QVariant((QVariant *)&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00575d5f:
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setPos(const QPointF &pos)
{
    if (d_ptr->pos == pos)
        return;

    if (d_ptr->inDestructor)
        return;

    // Update and repositition.
    if (!(d_ptr->flags & (ItemSendsGeometryChanges | ItemSendsScenePositionChanges))) {
        d_ptr->setPosHelper(pos);
        if (d_ptr->isWidget)
            static_cast<QGraphicsWidget *>(this)->d_func()->setGeometryFromSetPos();
        if (d_ptr->scenePosDescendants)
            d_ptr->sendScenePosChange();
        return;
    }

    // Notify the item that the position is changing.
    const QVariant newPosVariant(itemChange(ItemPositionChange, QVariant::fromValue<QPointF>(pos)));
    QPointF newPos = newPosVariant.toPointF();
    if (newPos == d_ptr->pos)
        return;

    // Update and repositition.
    d_ptr->setPosHelper(newPos);

    // Send post-notification.
    itemChange(QGraphicsItem::ItemPositionHasChanged, newPosVariant);
    d_ptr->sendScenePosChange();
}